

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatconfig.c
# Opt level: O0

int ecx_reconfig_slave(ecx_contextt *context,uint16 slave,int timeout)

{
  uint16 ADP;
  uint16 uVar1;
  int iVar2;
  int local_2c;
  int iStack_28;
  uint16 configadr;
  int FMMUc;
  int nSM;
  int state;
  int timeout_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  ADP = context->slavelist[slave].configadr;
  iVar2 = ecx_FPWRw(context->port,ADP,0x120,1,timeout);
  if (iVar2 < 1) {
    context_local._4_4_ = 0;
  }
  else {
    ecx_eeprom2pdi(context,slave);
    uVar1 = ecx_statecheck(context,slave,1,2000000);
    FMMUc = (int)uVar1;
    if (FMMUc == 1) {
      for (iStack_28 = 0; iStack_28 < 8; iStack_28 = iStack_28 + 1) {
        if (context->slavelist[slave].SM[iStack_28].StartAddr != 0) {
          ecx_FPWR(context->port,ADP,(short)((long)iStack_28 << 3) + 0x800,8,
                   context->slavelist[slave].SM + iStack_28,timeout);
        }
      }
      ecx_FPWRw(context->port,ADP,0x120,2,timeout);
      uVar1 = ecx_statecheck(context,slave,2,2000000);
      FMMUc = (int)uVar1;
      if (FMMUc == 2) {
        if (context->slavelist[slave].PO2SOconfig != (_func_int_uint16 *)0x0) {
          (*context->slavelist[slave].PO2SOconfig)(slave);
        }
        ecx_FPWRw(context->port,ADP,0x120,4,timeout);
        uVar1 = ecx_statecheck(context,slave,4,2000000);
        FMMUc = (int)uVar1;
        for (local_2c = 0; local_2c < (int)(uint)context->slavelist[slave].FMMUunused;
            local_2c = local_2c + 1) {
          ecx_FPWR(context->port,ADP,(short)((long)local_2c << 4) + 0x600,0x10,
                   context->slavelist[slave].FMMU + local_2c,timeout);
        }
      }
    }
    context_local._4_4_ = FMMUc;
  }
  return context_local._4_4_;
}

Assistant:

int ecx_reconfig_slave(ecx_contextt *context, uint16 slave, int timeout)
{
   int state, nSM, FMMUc;
   uint16 configadr;
   
   configadr = context->slavelist[slave].configadr;
   if (ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_INIT) , timeout) <= 0)
   {
      return 0;
   }
   state = 0;
   ecx_eeprom2pdi(context, slave); /* set Eeprom control to PDI */         
   /* check state change init */
   state = ecx_statecheck(context, slave, EC_STATE_INIT, EC_TIMEOUTSTATE);
   if(state == EC_STATE_INIT)
   {
      /* program all enabled SM */
      for( nSM = 0 ; nSM < EC_MAXSM ; nSM++ )
      {   
         if (context->slavelist[slave].SM[nSM].StartAddr)
         {   
            ecx_FPWR(context->port, configadr, ECT_REG_SM0 + (nSM * sizeof(ec_smt)),
               sizeof(ec_smt), &context->slavelist[slave].SM[nSM], timeout);
         }
      }
      ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_PRE_OP) , timeout);
      state = ecx_statecheck(context, slave, EC_STATE_PRE_OP, EC_TIMEOUTSTATE); /* check state change pre-op */
      if( state == EC_STATE_PRE_OP)
      {
         /* execute special slave configuration hook Pre-Op to Safe-OP */
         if(context->slavelist[slave].PO2SOconfig) /* only if registered */
         {       
            context->slavelist[slave].PO2SOconfig(slave);         
         }
         ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_SAFE_OP) , timeout); /* set safeop status */
         state = ecx_statecheck(context, slave, EC_STATE_SAFE_OP, EC_TIMEOUTSTATE); /* check state change safe-op */
         /* program configured FMMU */
         for( FMMUc = 0 ; FMMUc < context->slavelist[slave].FMMUunused ; FMMUc++ )
         {   
            ecx_FPWR(context->port, configadr, ECT_REG_FMMU0 + (sizeof(ec_fmmut) * FMMUc),
               sizeof(ec_fmmut), &context->slavelist[slave].FMMU[FMMUc], timeout);
         }
      }
   }

   return state;      
}